

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O2

int testing::internal::
    CountIf<std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>,bool(*)(testing::TestSuite_const*)>
              (vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *c,
              _func_bool_TestSuite_ptr *predicate)

{
  bool bVar1;
  pointer ppTVar2;
  int iVar3;
  
  iVar3 = 0;
  for (ppTVar2 = (c->super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      ppTVar2 !=
      (c->super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>)._M_impl.
      super__Vector_impl_data._M_finish; ppTVar2 = ppTVar2 + 1) {
    bVar1 = (*predicate)(*ppTVar2);
    iVar3 = iVar3 + (uint)bVar1;
  }
  return iVar3;
}

Assistant:

inline int CountIf(const Container& c, Predicate predicate) {
  // Implemented as an explicit loop since std::count_if() in libCstd on
  // Solaris has a non-standard signature.
  int count = 0;
  for (auto it = c.begin(); it != c.end(); ++it) {
    if (predicate(*it)) ++count;
  }
  return count;
}